

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O0

int dwarf_get_loclist_context_basics
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned *header_offset,
              Dwarf_Small *offset_size,Dwarf_Small *extension_size,uint *version,
              Dwarf_Small *address_size,Dwarf_Small *segment_selector_size,
              Dwarf_Unsigned *offset_entry_count,Dwarf_Unsigned *offset_of_offset_array,
              Dwarf_Unsigned *offset_of_first_loclistentry,
              Dwarf_Unsigned *offset_past_last_loclistentry,Dwarf_Error *error)

{
  Dwarf_Loclists_Context pDVar1;
  Dwarf_Loclists_Context con;
  uint *version_local;
  Dwarf_Small *extension_size_local;
  Dwarf_Small *offset_size_local;
  Dwarf_Unsigned *header_offset_local;
  Dwarf_Unsigned context_index_local;
  Dwarf_Debug dbg_local;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_context_basics()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (dbg->de_loclists_context_count == 0) {
    dbg_local._4_4_ = -1;
  }
  else if (context_index < dbg->de_loclists_context_count) {
    pDVar1 = dbg->de_loclists_context[context_index];
    if ((pDVar1 == (Dwarf_Loclists_Context)0x0) || (pDVar1->lc_magic != 0xadab4)) {
      _dwarf_error_string(dbg,error,0x51,
                          "DW_DLE_DBG_NULLcontext NULL or not LOCLISTS_MAGIC found in dwarf_get_loclist_context_basics()"
                         );
      dbg_local._4_4_ = 1;
    }
    else {
      if (header_offset != (Dwarf_Unsigned *)0x0) {
        *header_offset = pDVar1->lc_header_offset;
      }
      if (offset_size != (Dwarf_Small *)0x0) {
        *offset_size = pDVar1->lc_offset_size;
      }
      if (extension_size != (Dwarf_Small *)0x0) {
        *extension_size = pDVar1->lc_extension_size;
      }
      if (version != (uint *)0x0) {
        *version = (uint)pDVar1->lc_version;
      }
      if (address_size != (Dwarf_Small *)0x0) {
        *address_size = pDVar1->lc_address_size;
      }
      if (segment_selector_size != (Dwarf_Small *)0x0) {
        *segment_selector_size = pDVar1->lc_segment_selector_size;
      }
      if (offset_entry_count != (Dwarf_Unsigned *)0x0) {
        *offset_entry_count = pDVar1->lc_offset_entry_count;
      }
      if (offset_of_offset_array != (Dwarf_Unsigned *)0x0) {
        *offset_of_offset_array = pDVar1->lc_offsets_off_in_sect;
      }
      if (offset_of_first_loclistentry != (Dwarf_Unsigned *)0x0) {
        *offset_of_first_loclistentry = pDVar1->lc_first_loclist_offset;
      }
      if (offset_past_last_loclistentry != (Dwarf_Unsigned *)0x0) {
        *offset_past_last_loclistentry = pDVar1->lc_past_last_loclist_offset;
      }
      dbg_local._4_4_ = 0;
    }
  }
  else {
    dbg_local._4_4_ = -1;
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_loclist_context_basics(Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned * header_offset,
    Dwarf_Small    * offset_size,
    Dwarf_Small    * extension_size,
    unsigned       * version, /* 5 */
    Dwarf_Small    * address_size,
    Dwarf_Small    * segment_selector_size,
    Dwarf_Unsigned * offset_entry_count,
    Dwarf_Unsigned * offset_of_offset_array,
    Dwarf_Unsigned * offset_of_first_loclistentry,
    Dwarf_Unsigned * offset_past_last_loclistentry,
    Dwarf_Error *error)
{
    Dwarf_Loclists_Context con = 0;

    CHECK_DBG(dbg,error,"dwarf_get_loclist_context_basics()");
    if (!dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (context_index >= dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_loclists_context[context_index];
    if (!con || con->lc_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(dbg, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "context NULL or not LOCLISTS_MAGIC "
            "found in "
            "dwarf_get_loclist_context_basics()");
        return DW_DLV_ERROR;
    }
    if (header_offset) {
        *header_offset = con->lc_header_offset;
    }
    if (offset_size) {
        *offset_size = con->lc_offset_size;
    }
    if (extension_size) {
        *extension_size = con->lc_extension_size;
    }
    if (version) {
        *version = con->lc_version;
    }
    if (address_size) {
        *address_size = con->lc_address_size;
    }
    if (segment_selector_size) {
        *segment_selector_size = con->lc_segment_selector_size;
    }
    if (offset_entry_count) {
        *offset_entry_count = con->lc_offset_entry_count;
    }
    if (offset_of_offset_array) {
        *offset_of_offset_array = con->lc_offsets_off_in_sect;
    }
    if (offset_of_first_loclistentry) {
        *offset_of_first_loclistentry = con->lc_first_loclist_offset;
    }
    if (offset_past_last_loclistentry) {
        *offset_past_last_loclistentry =
            con->lc_past_last_loclist_offset;
    }
    return DW_DLV_OK;
}